

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall
node::BlockManager::WriteBlockToDisk(BlockManager *this,CBlock *block,FlatFilePos *pos)

{
  long lVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  AutoFile *this_00;
  int64_t iVar3;
  size_t in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000050;
  char (*in_stack_00000060) [17];
  long fileOutPos;
  uint nSize;
  AutoFile fileout;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  CBlock *in_stack_fffffffffffffeb0;
  AutoFile *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  undefined8 in_stack_fffffffffffffee8;
  FlatFilePos *in_stack_fffffffffffffef0;
  BlockManager *in_stack_fffffffffffffef8;
  LogFlags in_stack_ffffffffffffff10;
  int source_line;
  undefined4 local_c8;
  ConstevalFormatString<1U> in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  byte bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  OpenBlockFile(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
  bVar2 = AutoFile::IsNull((AutoFile *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                          );
  if (bVar2) {
    source_line = 0;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
    in_stack_fffffffffffffea8 = 4;
    logging_function._M_str._0_7_ = in_stack_ffffffffffffff78;
    logging_function._M_len = in_RDI;
    logging_function._M_str._7_1_ = in_stack_ffffffffffffff7f;
    source_file._M_str = in_RSI;
    source_file._M_len = in_RDX;
    LogPrintFormatInternal<char[17]>
              (logging_function,source_file,source_line,in_stack_ffffffffffffff10,in_stack_00000050,
               in_stack_ffffffffffffff58,in_stack_00000060);
  }
  else {
    TransactionSerParams::operator()
              ((TransactionSerParams *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
              ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)in_stack_fffffffffffffeb0);
    GetParams((BlockManager *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    CChainParams::MessageStart
              ((CChainParams *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    this_00 = AutoFile::operator<<
                        (in_stack_fffffffffffffeb8,
                         (array<unsigned_char,_4UL> *)in_stack_fffffffffffffeb0);
    AutoFile::operator<<(in_stack_fffffffffffffeb8,(uint *)in_stack_fffffffffffffeb0);
    iVar3 = AutoFile::tell(this_00);
    local_c8 = (undefined4)iVar3;
    *(undefined4 *)(in_RDX + 4) = local_c8;
    TransactionSerParams::operator()
              ((TransactionSerParams *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    AutoFile::operator<<
              (in_stack_fffffffffffffeb8,
               (ParamsWrapper<TransactionSerParams,_const_CBlock> *)in_stack_fffffffffffffeb0);
  }
  bVar4 = !bVar2;
  AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::WriteBlockToDisk(const CBlock& block, FlatFilePos& pos) const
{
    // Open history file to append
    AutoFile fileout{OpenBlockFile(pos)};
    if (fileout.IsNull()) {
        LogError("%s: OpenBlockFile failed\n", __func__);
        return false;
    }

    // Write index header
    unsigned int nSize = GetSerializeSize(TX_WITH_WITNESS(block));
    fileout << GetParams().MessageStart() << nSize;

    // Write block
    long fileOutPos = fileout.tell();
    pos.nPos = (unsigned int)fileOutPos;
    fileout << TX_WITH_WITNESS(block);

    return true;
}